

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O3

void * wm_event_loop(void *passed_state)

{
  logger *log;
  uint uVar1;
  uint uVar2;
  int iVar3;
  natwm_error nVar4;
  xcb_generic_event_t *event;
  undefined8 uVar5;
  char *fmt;
  void *pvVar6;
  undefined1 auVar7 [32];
  undefined1 auStack_d8 [8];
  fd_set fds;
  timespec timeout;
  
  if (passed_state == (void *)0x0) {
    internal_logger(natwm_logger,LEVEL_ERROR,"Received invalid passed state to event loop");
LAB_00103fdc:
    pvVar6 = (void *)0xffffffffffffffff;
  }
  else {
    uVar1 = xcb_get_file_descriptor(*(undefined8 *)((long)passed_state + 8));
    fds.__fds_bits[0xf] = 0;
    if (status == 0) {
      uVar2 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar2 = uVar1;
      }
      do {
        auVar7 = ZEXT1632(ZEXT816(0) << 0x40);
        fds.__fds_bits[0xb] = auVar7._0_8_;
        fds.__fds_bits[0xc] = auVar7._8_8_;
        fds.__fds_bits[0xd] = auVar7._16_8_;
        fds.__fds_bits[0xe] = auVar7._24_8_;
        fds.__fds_bits[7] = auVar7._0_8_;
        fds.__fds_bits[8] = auVar7._8_8_;
        fds.__fds_bits[9] = auVar7._16_8_;
        fds.__fds_bits[10] = auVar7._24_8_;
        _auStack_d8 = ZEXT1632(ZEXT816(0) << 0x40);
        fds.__fds_bits[3] = auStack_d8;
        fds.__fds_bits[4] = auStack_d8._8_8_;
        fds.__fds_bits[5] = auStack_d8._16_8_;
        fds.__fds_bits[6] = auStack_d8._24_8_;
        fds.__fds_bits[(long)((int)uVar2 >> 6) + -1] =
             fds.__fds_bits[(long)((int)uVar2 >> 6) + -1] | 1L << ((ulong)uVar1 & 0x3f);
        iVar3 = xcb_connection_has_error(*(undefined8 *)((long)passed_state + 8));
        if ((iVar3 != 0) && (status == 0)) {
          fmt = "Connection to X server closed";
LAB_00103fc3:
          internal_logger(natwm_logger,LEVEL_ERROR,fmt);
          status = -1;
          goto LAB_00103fdc;
        }
        iVar3 = pselect(uVar1 + 1,(fd_set *)auStack_d8,(fd_set *)0x0,(fd_set *)0x0,
                        (timespec *)(fds.__fds_bits + 0xf),(__sigset_t *)0x0);
        if (iVar3 != 0) {
          if (iVar3 < 0) {
            fmt = "pselect failed";
            goto LAB_00103fc3;
          }
          event = (xcb_generic_event_t *)xcb_poll_for_event(*(undefined8 *)((long)passed_state + 8))
          ;
          while (event != (xcb_generic_event_t *)0x0) {
            nVar4 = event_handle((natwm_state *)passed_state,event);
            log = natwm_logger;
            if (nVar4 == NO_ERROR) {
              free(event);
              xcb_flush(*(undefined8 *)((long)passed_state + 8));
            }
            else {
              if (nVar4 != NOT_FOUND_ERROR) {
                uVar5 = xcb_event_get_label(event->response_type & 0x7f);
                internal_logger(log,LEVEL_WARNING,"Failed to perform %s",uVar5);
              }
              free(event);
            }
            event = (xcb_generic_event_t *)
                    xcb_poll_for_event(*(undefined8 *)((long)passed_state + 8));
          }
        }
      } while (status == 0);
    }
    pvVar6 = (void *)0x0;
    internal_logger(natwm_logger,LEVEL_INFO,"Disconnected...");
  }
  return pvVar6;
}

Assistant:

static void *wm_event_loop(void *passed_state)
{
        struct natwm_state *state = (struct natwm_state *)passed_state;
        xcb_generic_event_t *event = XCB_NONE;

        if (state == NULL) {
                LOG_ERROR(natwm_logger, "Received invalid passed state to event loop");

                return (intptr_t *)-1;
        }

        fd_set fds;
        int xcb_fd = xcb_get_file_descriptor(state->xcb);

        // If there hasn't been an X event in 25 milliseconds then we timeout
        // and check for any interuptions or errors
        struct timespec timeout = {
                .tv_sec = 0,
                .tv_nsec = 25000000, // 25 Milliseconds
        };

        while (status == RUNNING) {
                FD_ZERO(&fds);
                FD_SET(xcb_fd, &fds);

                if (xcb_connection_has_error(state->xcb) && status == RUNNING) {
                        LOG_ERROR(natwm_logger, "Connection to X server closed");

                        goto handle_error;
                }

                int num = pselect(xcb_fd + 1, &fds, NULL, NULL, &timeout, NULL);

                if (num == 0) {
                        // No events to process
                        continue;
                }

                if (num < 0) {
                        LOG_ERROR(natwm_logger, "pselect failed");

                        goto handle_error;
                }

                while ((event = xcb_poll_for_event(state->xcb))) {
                        enum natwm_error err = event_handle(state, event);

                        if (err == NOT_FOUND_ERROR) {
                                free(event);

                                continue;
                        }

                        if (err != NO_ERROR) {
                                uint8_t rtype = event->response_type;
                                uint8_t type = (uint8_t)(GET_EVENT_TYPE(rtype));

                                LOG_WARNING(natwm_logger,
                                            "Failed to perform %s",
                                            xcb_event_get_label(type));

                                free(event);

                                continue;
                        }

                        free(event);

                        xcb_flush(state->xcb);
                }
        }

        // Event loop stopped disconnect from x
        LOG_INFO(natwm_logger, "Disconnected...");

        return (intptr_t *)0;

handle_error:
        status = STOPPED;

        return (intptr_t *)-1;
}